

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeffects.cpp
# Opt level: O0

void qScrollEffect(QWidget *w,DirFlags orient,int time)

{
  pointer __p;
  undefined4 in_EDX;
  undefined4 in_ESI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QRollEffect *unaff_retaddr;
  QRollEffect *in_stack_00000018;
  WindowFlags flags;
  WindowFlags in_stack_0000006c;
  pointer in_stack_ffffffffffffffd8;
  WindowType flags_00;
  long lVar1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<QRollEffect,_DeleteLater>::reset
            ((unique_ptr<QRollEffect,_DeleteLater> *)CONCAT44(in_ESI,in_EDX),
             in_stack_ffffffffffffffd8);
  flags_00 = (WindowType)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  if (in_RDI != (QObject *)0x0) {
    QCoreApplication::sendPostedEvents(in_RDI,0xd);
    QCoreApplication::sendPostedEvents(in_RDI,0xe);
    QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)CONCAT44(in_ESI,in_EDX),flags_00);
    __p = (pointer)operator_new(0x90);
    QRollEffect::QRollEffect(in_stack_00000018,w,in_stack_0000006c,orient);
    std::unique_ptr<QRollEffect,_DeleteLater>::reset
              ((unique_ptr<QRollEffect,_DeleteLater> *)CONCAT44(in_ESI,in_EDX),__p);
    std::unique_ptr<QRollEffect,_DeleteLater>::operator->
              ((unique_ptr<QRollEffect,_DeleteLater> *)0x596e4e);
    QRollEffect::run(unaff_retaddr,(int)((ulong)lVar1 >> 0x20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qScrollEffect(QWidget* w, QEffects::DirFlags orient, int time)
{
    q_roll.reset();

    if (!w)
        return;

    QCoreApplication::sendPostedEvents(w, QEvent::Move);
    QCoreApplication::sendPostedEvents(w, QEvent::Resize);
    Qt::WindowFlags flags = Qt::ToolTip;

    // those can be popups - they would steal the focus, but are disabled
    q_roll.reset(new QRollEffect(w, flags, orient));
    q_roll->run(time);
}